

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_array_expression_t *expr)

{
  expression_type_t eVar1;
  iterator iVar2;
  vector<long,_std::allocator<long>_> *pvVar3;
  int iVar4;
  typed_var_expression_t *ptVar5;
  typed_expression_t *ptVar6;
  ulong uVar7;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_expression_compiler;
  ulong local_60;
  undefined **local_58;
  vector<long,_std::allocator<long>_> *local_50;
  string local_48;
  
  eVar1 = (expr->super_typed_lvalue_expression_t).super_typed_expression_t._type;
  if ((EXPR_TYPE_CLKLVALUE < eVar1) ||
     ((0x4c0U >> (eVar1 & (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_CLKCONSTR_DIAGONAL)) & 1) == 0))
  {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a lvalue","");
    invalid_expression(this,(typed_expression_t *)expr,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  ptVar5 = typed_array_expression_t::variable(expr);
  uVar7 = (ulong)ptVar5->_id;
  ptVar5 = typed_array_expression_t::variable(expr);
  iVar4 = (**(code **)(*(long *)&(ptVar5->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))(ptVar5);
  local_50 = (this->_bytecode_back_inserter).container;
  local_58 = &PTR__typed_expression_visitor_t_001e1ab0;
  local_60 = 5;
  iVar2._M_current =
       (local_50->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (local_50->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (local_50,iVar2,(long *)&local_60);
  }
  else {
    *iVar2._M_current = 5;
    (local_50->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_60 = uVar7;
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar3,iVar2,(long *)&local_60);
  }
  else {
    *iVar2._M_current = uVar7;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
    local_60 = uVar7;
  }
  ptVar6 = typed_array_expression_t::offset(expr);
  (**(code **)(*(long *)ptVar6 + 0x30))(ptVar6,&local_58);
  local_60 = 2;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar3,iVar2,(long *)&local_60);
  }
  else {
    *iVar2._M_current = 2;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_60 = 0;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar3,iVar2,(long *)&local_60);
  }
  else {
    *iVar2._M_current = 0;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_60 = (ulong)(iVar4 - 1);
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar3,iVar2,(long *)&local_60);
  }
  else {
    *iVar2._M_current = local_60;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_60 = 0x13;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar3,iVar2,(long *)&local_60);
  }
  else {
    *iVar2._M_current = 0x13;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_array_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKLVALUE) && (expr.type() != tchecker::EXPR_TYPE_INTLVALUE) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTLVALUE))
      invalid_expression(expr, "a lvalue");

    // offset bounds
    auto const id = expr.variable().id();
    auto const lowoffset = 0;
    auto const highoffset = expr.variable().size() - 1;

    // Write bytecode
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_expression_compiler(_bytecode_back_inserter);

    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = id;
    expr.offset().visit(rvalue_expression_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = lowoffset;
    _bytecode_back_inserter = highoffset;
    _bytecode_back_inserter = tchecker::VM_SUM;
  }